

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  sqlite3_tokenizer_module *psVar5;
  char **ppcVar6;
  sqlite3_uint64 n_00;
  long lVar7;
  long lVar8;
  char **p;
  long in_FS_OFFSET;
  int n;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  n = 0;
  __s = sqlite3_mprintf("%s");
  iVar1 = 7;
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    pcVar3 = sqlite3Fts3NextToken(__s,&n);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = __s;
    }
    lVar7 = (long)n;
    pcVar3[lVar7] = '\0';
    sqlite3Fts3Dequote(pcVar3);
    sVar4 = strlen(pcVar3);
    psVar5 = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,pcVar3,(int)sVar4 + 1);
    if (psVar5 == (sqlite3_tokenizer_module *)0x0) {
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",pcVar3);
      iVar1 = 1;
    }
    else {
      n_00 = 8;
      lVar8 = 0;
      p = (char **)0x0;
      for (pcVar3 = pcVar3 + lVar7; pcVar3 + 1 < __s + sVar2; pcVar3 = pcVar3 + lVar7) {
        pcVar3 = sqlite3Fts3NextToken(pcVar3 + 1,&n);
        if (pcVar3 == (char *)0x0) break;
        ppcVar6 = (char **)sqlite3_realloc64(p,n_00);
        if (ppcVar6 == (char **)0x0) {
          sqlite3_free(__s);
          sqlite3_free(p);
          iVar1 = 7;
          goto LAB_001b0412;
        }
        ppcVar6[lVar8] = pcVar3;
        lVar7 = (long)n;
        pcVar3[lVar7] = '\0';
        sqlite3Fts3Dequote(pcVar3);
        n_00 = n_00 + 8;
        lVar8 = lVar8 + 1;
        p = ppcVar6;
      }
      iVar1 = (*psVar5->xCreate)((int)lVar8,p,ppTok);
      if (iVar1 == 0) {
        (*ppTok)->pModule = psVar5;
      }
      else {
        sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer");
      }
      sqlite3_free(p);
    }
    sqlite3_free(__s);
  }
LAB_001b0412:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m;
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}